

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingExtension
          (MergedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  pointer ppDVar1;
  DescriptorDatabase *pDVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  undefined1 local_110 [8];
  FileDescriptorProto temp;
  
  uVar7 = 0;
  temp.source_code_info_ = (SourceCodeInfo *)output;
  while( true ) {
    bVar8 = (byte)output;
    ppDVar1 = (this->sources_).
              super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->sources_).
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3;
    if (uVar6 <= uVar7) break;
    pDVar2 = ppDVar1[uVar7];
    output = (FileDescriptorProto *)temp.source_code_info_;
    iVar4 = (*pDVar2->_vptr_DescriptorDatabase[4])(pDVar2,containing_type,(ulong)(uint)field_number)
    ;
    if ((char)iVar4 != '\0') {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_110);
      uVar3 = 0;
      goto LAB_002e0154;
    }
    uVar7 = uVar7 + 1;
  }
  goto LAB_002e0197;
  while( true ) {
    pDVar2 = (this->sources_).
             super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5];
    iVar4 = (*pDVar2->_vptr_DescriptorDatabase[2])
                      (pDVar2,temp.source_code_info_[3].location_.super_RepeatedPtrFieldBase.rep_,
                       (FileDescriptorProto *)local_110);
    uVar3 = uVar5 + 1;
    if ((char)iVar4 != '\0') break;
LAB_002e0154:
    uVar5 = uVar3;
    if (uVar7 == uVar5) break;
  }
  bVar8 = uVar7 <= uVar5;
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_110);
LAB_002e0197:
  return (bool)(uVar7 < uVar6 & bVar8);
}

Assistant:

bool MergedDescriptorDatabase::FindFileContainingExtension(
    const std::string& containing_type, int field_number,
    FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileContainingExtension(containing_type, field_number,
                                                 output)) {
      // The symbol was found in source i.  However, if one of the previous
      // sources defines a file with the same name (which presumably doesn't
      // contain the symbol, since it wasn't found in that source), then we
      // must hide it from the caller.
      FileDescriptorProto temp;
      for (int j = 0; j < i; j++) {
        if (sources_[j]->FindFileByName(output->name(), &temp)) {
          // Found conflicting file in a previous source.
          return false;
        }
      }
      return true;
    }
  }
  return false;
}